

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddGenCof.c
# Opt level: O2

DdNode * cuddBddCharToVect(DdManager *dd,DdNode *f,DdNode *x)

{
  int *piVar1;
  uint uVar2;
  uint uVar3;
  DdNode *f_00;
  DdNode *pDVar4;
  DdNode *pDVar5;
  DdNode *pDVar6;
  DdNode *pDVar7;
  
  while( true ) {
    f_00 = f;
    pDVar4 = cuddCacheLookup2(dd,cuddBddCharToVect,f_00,x);
    if (pDVar4 != (DdNode *)0x0) {
      return pDVar4;
    }
    pDVar4 = (DdNode *)((ulong)f_00 & 0xfffffffffffffffe);
    uVar3 = 0x7fffffff;
    if ((ulong)pDVar4->index != 0x7fffffff) {
      uVar3 = dd->perm[pDVar4->index];
    }
    uVar2 = dd->perm[x->index];
    if (uVar2 < uVar3) {
      return x;
    }
    pDVar7 = (DdNode *)((ulong)dd->one ^ 1);
    pDVar6 = (DdNode *)((ulong)(pDVar4->type).kids.T ^ (ulong)(f_00 != pDVar4));
    pDVar5 = (DdNode *)((ulong)(f_00 != pDVar4) ^ (ulong)(pDVar4->type).kids.E);
    if (uVar3 == uVar2) break;
    f = pDVar5;
    if ((pDVar6 != pDVar7) && (f = pDVar6, pDVar5 != pDVar7)) {
      pDVar6 = cuddBddCharToVect(dd,pDVar6,x);
      if (pDVar6 != (DdNode *)0x0) {
        piVar1 = (int *)(((ulong)pDVar6 & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + 1;
        pDVar5 = cuddBddCharToVect(dd,pDVar5,x);
        if (pDVar5 != (DdNode *)0x0) {
          piVar1 = (int *)(((ulong)pDVar5 & 0xfffffffffffffffe) + 4);
          *piVar1 = *piVar1 + 1;
          pDVar4 = cuddBddIteRecur(dd,dd->vars[pDVar4->index],pDVar6,pDVar5);
          if (pDVar4 != (DdNode *)0x0) {
            piVar1 = (int *)(((ulong)pDVar6 & 0xfffffffffffffffe) + 4);
            *piVar1 = *piVar1 + -1;
            piVar1 = (int *)(((ulong)pDVar5 & 0xfffffffffffffffe) + 4);
            *piVar1 = *piVar1 + -1;
            cuddCacheInsert2(dd,cuddBddCharToVect,f_00,x,pDVar4);
            return pDVar4;
          }
          Cudd_IterDerefBdd(dd,pDVar6);
          pDVar6 = pDVar5;
        }
        Cudd_IterDerefBdd(dd,pDVar6);
      }
      return (DdNode *)0x0;
    }
  }
  if (pDVar6 == pDVar7) {
    return pDVar7;
  }
  if (pDVar5 != pDVar7) {
    return x;
  }
  return dd->one;
}

Assistant:

static DdNode *
cuddBddCharToVect(
  DdManager * dd,
  DdNode * f,
  DdNode * x)
{
    unsigned int topf;
    unsigned int level;
    int comple;

    DdNode *one, *zero, *res, *F, *fT, *fE, *T, *E;

    statLine(dd);
    /* Check the cache. */
    res = cuddCacheLookup2(dd, cuddBddCharToVect, f, x);
    if (res != NULL) {
        return(res);
    }

    F = Cudd_Regular(f);

    topf = cuddI(dd,F->index);
    level = dd->perm[x->index];

    if (topf > level) return(x);

    one = DD_ONE(dd);
    zero = Cudd_Not(one);

    comple = F != f;
    fT = Cudd_NotCond(cuddT(F),comple);
    fE = Cudd_NotCond(cuddE(F),comple);

    if (topf == level) {
        if (fT == zero) return(zero);
        if (fE == zero) return(one);
        return(x);
    }

    /* Here topf < level. */
    if (fT == zero) return(cuddBddCharToVect(dd, fE, x));
    if (fE == zero) return(cuddBddCharToVect(dd, fT, x));

    T = cuddBddCharToVect(dd, fT, x);
    if (T == NULL) {
        return(NULL);
    }
    cuddRef(T);
    E = cuddBddCharToVect(dd, fE, x);
    if (E == NULL) {
        Cudd_IterDerefBdd(dd,T);
        return(NULL);
    }
    cuddRef(E);
    res = cuddBddIteRecur(dd, dd->vars[F->index], T, E);
    if (res == NULL) {
        Cudd_IterDerefBdd(dd,T);
        Cudd_IterDerefBdd(dd,E);
        return(NULL);
    }
    cuddDeref(T);
    cuddDeref(E);
    cuddCacheInsert2(dd, cuddBddCharToVect, f, x, res);
    return(res);

}